

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

JointIndex __thiscall
iDynTree::Model::addJoint
          (Model *this,string *link1,string *link2,string *jointName,IJointConstPtr joint)

{
  int iVar1;
  undefined4 extraout_var;
  LinkIndex LVar2;
  LinkIndex LVar3;
  JointIndex JVar4;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IJointConstPtr joint_00;
  
  iVar1 = (*joint->_vptr_IJoint[2])(joint);
  joint_00 = (IJointConstPtr)CONCAT44(extraout_var,iVar1);
  LVar2 = getLinkIndex(this,link1);
  LVar3 = getLinkIndex(this,link2);
  if (LVar2 == LINK_INVALID_INDEX) {
    std::operator+(&local_50,"a link of name ",link1);
    std::operator+(&local_70,&local_50," is not present in the model");
    std::__cxx11::string::~string((string *)&local_50);
    iDynTree::reportError("Model","addJoint",local_70._M_dataplus._M_p);
  }
  else {
    if (LVar3 != LINK_INVALID_INDEX) {
      (*joint_00->_vptr_IJoint[5])(joint_00,LVar2,LVar3);
      JVar4 = addJoint(this,jointName,joint_00);
      (*joint_00->_vptr_IJoint[1])(joint_00);
      return JVar4;
    }
    std::operator+(&local_50,"a link of name ",link2);
    std::operator+(&local_70,&local_50," is not present in the model");
    std::__cxx11::string::~string((string *)&local_50);
    iDynTree::reportError("Model","addJoint",local_70._M_dataplus._M_p);
  }
  JVar4 = JOINT_INVALID_INDEX;
  std::__cxx11::string::~string((string *)&local_70);
  return JVar4;
}

Assistant:

JointIndex Model::addJoint(const std::string & link1, const std::string & link2,
                            const std::string & jointName, IJointConstPtr joint)
{
    IJointPtr jointCopy = joint->clone();

    LinkIndex link1Index = this->getLinkIndex(link1);
    LinkIndex link2Index = this->getLinkIndex(link2);

    if( link1Index == LINK_INVALID_INDEX )
    {
        std::string error = "a link of name " + link1 + " is not present in the model";
        reportError("Model","addJoint",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    if( link2Index == LINK_INVALID_INDEX )
    {
        std::string error = "a link of name " + link2 + " is not present in the model";
        reportError("Model","addJoint",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    jointCopy->setAttachedLinks(link1Index,link2Index);

    JointIndex jntIdx = addJoint(jointName,jointCopy);

    delete jointCopy;

    return jntIdx;
}